

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

AssertionResult __thiscall testing::AssertionResult::operator!(AssertionResult *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  byte *in_RSI;
  AssertionResult AVar1;
  
  this->success_ = (bool)(*in_RSI ^ 1);
  (this->message_).ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 8) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator<<(this,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     (in_RSI + 8));
    in_RDX.ptr_ = extraout_RDX;
  }
  AVar1.message_.ptr_ = in_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult AssertionResult::operator!() const {
  AssertionResult negation(!success_);
  if (message_.get() != NULL)
    negation << *message_;
  return negation;
}